

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.h
# Opt level: O2

void assert_dbl_near(double exp,double real,double tol,char *caller,int line)

{
  char *fmt;
  double dVar1;
  double dVar2;
  
  if (NAN(exp)) {
    if (!NAN(real)) {
      fmt = "%s:%d expected NAN, got %0.3e";
      exp = real;
      goto LAB_0012c8f8;
    }
  }
  else if (NAN(real)) {
    fmt = "%s:%d expected %0.3e, got NAN";
    goto LAB_0012c8f8;
  }
  if (ABS(exp) == INFINITY) {
    if (ABS(real) == INFINITY) goto LAB_0012c895;
    fmt = "%s:%d expected INFINITY, got %0.3e";
    exp = real;
  }
  else {
    if (ABS(real) != INFINITY) {
LAB_0012c895:
      dVar1 = exp - real;
      dVar2 = -dVar1;
      if (-dVar1 <= dVar1) {
        dVar2 = dVar1;
      }
      if (tol + 2.220446049250313e-16 < dVar2) {
        unit_error("%s:%d expected %0.3e, got %0.3e (diff %0.3e, tol %0.3e)",
                   "/workspace/llm4binary/github/license_c_cmakelists/ELIFE-ASU[P]Inform/test/unittests/utilities.c"
                   ,(ulong)caller & 0xffffffff);
      }
      return;
    }
    fmt = "%s:%d expected %0.3e, got INFINITY";
  }
LAB_0012c8f8:
  unit_error(fmt,exp,
             "/workspace/llm4binary/github/license_c_cmakelists/ELIFE-ASU[P]Inform/test/unittests/utilities.c"
             ,(ulong)caller & 0xffffffff);
}

Assistant:

inline static void assert_dbl_near(double exp, double real, double tol, char const *caller, int line)
{
  if (isnan(exp))
  {
    if (!isnan(real))
    {
      unit_error("%s:%d expected NAN, got %0.3e", caller, line, real);
    }
  }
  else if (isnan(real))
  {
    unit_error("%s:%d expected %0.3e, got NAN", caller, line, exp);
  }
  if (isinf(exp))
  {
    if (!isinf(real))
    {
      unit_error("%s:%d expected INFINITY, got %0.3e", caller, line, real);
    }
  }
  else if (isinf(real))
  {
    unit_error("%s:%d expected %0.3e, got INFINITY", caller, line, exp);
  }
  double diff = exp - real;
  tol += DBL_EPSILON;
  double absdiff = (diff < 0.) ? -diff : diff;
  if (absdiff > tol)
  {
    unit_error("%s:%d expected %0.3e, got %0.3e (diff %0.3e, tol %0.3e)", caller, line, exp, real, diff, tol);
  }
}